

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::IteratorImpl
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this,
          ParamGeneratorInterface<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
          *base,tuple<testing::internal::ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
                *generators,bool is_end)

{
  _func_int **in_RSI;
  ParamIteratorInterface<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
  *in_RDI;
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  *in_stack_ffffffffffffff78;
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  *in_stack_ffffffffffffff80;
  ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>
  *in_stack_ffffffffffffff88;
  IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this_00;
  
  ParamIteratorInterface<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
  ::ParamIteratorInterface(in_RDI);
  in_RDI->_vptr_ParamIteratorInterface = (_func_int **)&PTR__IteratorImpl_01fa3ce8;
  in_RDI[1]._vptr_ParamIteratorInterface = in_RSI;
  std::
  get<0ul,testing::internal::ParamGenerator<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xb578e2);
  ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>::begin
            (in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xb578fb);
  ParamGenerator<std::tuple<int,_int>_>::begin
            ((ParamGenerator<std::tuple<int,_int>_> *)in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *)
             in_stack_ffffffffffffff78,(ParamIterator<std::tuple<int,_int>_> *)0xb5791e);
  ParamIterator<std::tuple<int,_int>_>::~ParamIterator
            ((ParamIterator<std::tuple<int,_int>_> *)0xb5792a);
  ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>::~ParamIterator
            ((ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *)
             0xb57934);
  std::
  get<0ul,testing::internal::ParamGenerator<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xb5794c);
  ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>::end
            (in_stack_ffffffffffffff88);
  std::
  get<1ul,testing::internal::ParamGenerator<bool(*)(unsigned_char*,unsigned_char*,int,int,int,int,int)>,testing::internal::ParamGenerator<std::tuple<int,int>>>
            ((tuple<testing::internal::ParamGenerator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamGenerator<std::tuple<int,_int>_>_>
              *)0xb57965);
  ParamGenerator<std::tuple<int,_int>_>::end
            ((ParamGenerator<std::tuple<int,_int>_> *)in_stack_ffffffffffffff88);
  std::
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>,_true>
            (in_stack_ffffffffffffff80,
             (ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *)
             in_stack_ffffffffffffff78,(ParamIterator<std::tuple<int,_int>_> *)0xb57988);
  ParamIterator<std::tuple<int,_int>_>::~ParamIterator
            ((ParamIterator<std::tuple<int,_int>_> *)0xb57994);
  ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>::~ParamIterator
            ((ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)> *)
             0xb5799e);
  this_00 = (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *)(in_RDI + 6);
  std::
  tuple<testing::internal::ParamIterator<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int)>,_testing::internal::ParamIterator<std::tuple<int,_int>_>_>
  ::tuple(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  shared_ptr<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
  ::shared_ptr((shared_ptr<std::tuple<bool_(*)(unsigned_char_*,_unsigned_char_*,_int,_int,_int,_int,_int),_std::tuple<int,_int>_>_>
                *)0xb579f5);
  ComputeCurrentValue(this_00);
  return;
}

Assistant:

IteratorImpl(const ParamGeneratorInterface<ParamType>* base,
                 const std::tuple<ParamGenerator<T>...>& generators,
                 bool is_end)
        : base_(base),
          begin_(std::get<I>(generators).begin()...),
          end_(std::get<I>(generators).end()...),
          current_(is_end ? end_ : begin_) {
      ComputeCurrentValue();
    }